

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  ImVec2 IVar1;
  ImDrawListSharedData *pIVar2;
  ImDrawIdx IVar3;
  int iVar4;
  ImVec2 *pIVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  short sVar10;
  ImDrawIdx IVar11;
  uint uVar12;
  ImDrawIdx IVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  if (2 < points_count) {
    uVar9 = (ulong)(uint)points_count;
    IVar1 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 4) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      uVar8 = 0;
      do {
        this->_VtxWritePtr->pos = points[uVar8];
        this->_VtxWritePtr->uv = IVar1;
        this->_VtxWritePtr->col = col;
        this->_VtxWritePtr = this->_VtxWritePtr + 1;
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
      iVar4 = 3;
      if (3 < points_count) {
        iVar4 = points_count;
      }
      iVar7 = 2;
      sVar10 = 1;
      do {
        *this->_IdxWritePtr = (ImDrawIdx)this->_VtxCurrentIdx;
        this->_IdxWritePtr[1] = sVar10 + (short)this->_VtxCurrentIdx;
        this->_IdxWritePtr[2] = (short)this->_VtxCurrentIdx + (short)iVar7;
        this->_IdxWritePtr = this->_IdxWritePtr + 3;
        iVar7 = iVar7 + 1;
        sVar10 = sVar10 + 1;
      } while (iVar4 != iVar7);
      uVar12 = points_count & 0xffff;
    }
    else {
      fVar20 = this->_FringeScale;
      PrimReserve(this,points_count * 9 + -6,points_count * 2);
      uVar12 = this->_VtxCurrentIdx;
      IVar3 = (ImDrawIdx)uVar12;
      iVar4 = uVar12 + 2;
      iVar7 = 2;
      do {
        *this->_IdxWritePtr = IVar3;
        this->_IdxWritePtr[1] = (ImDrawIdx)iVar4;
        iVar4 = iVar4 + 2;
        this->_IdxWritePtr[2] = (ImDrawIdx)iVar4;
        this->_IdxWritePtr = this->_IdxWritePtr + 3;
        iVar7 = iVar7 + 1;
      } while (points_count != iVar7);
      pIVar2 = this->_Data;
      if ((pIVar2->TempBuffer).Capacity < points_count) {
        pIVar5 = (pIVar2->TempBuffer).Data;
        if (pIVar5 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar5);
        }
        pIVar5 = (ImVec2 *)ImGui::MemAlloc(uVar9 << 3);
        (pIVar2->TempBuffer).Data = pIVar5;
        (pIVar2->TempBuffer).Capacity = points_count;
      }
      pIVar5 = (this->_Data->TempBuffer).Data;
      uVar14 = (ulong)(points_count - 1);
      uVar8 = 1;
      if (1 < points_count) {
        uVar8 = (ulong)(uint)points_count;
      }
      uVar15 = 0;
      uVar6 = uVar14;
      do {
        iVar4 = (int)uVar6;
        fVar17 = points[uVar15].x - points[iVar4].x;
        fVar19 = points[uVar15].y - points[iVar4].y;
        fVar16 = fVar17 * fVar17 + fVar19 * fVar19;
        if (0.0 < fVar16) {
          if (fVar16 < 0.0) {
            fVar16 = sqrtf(fVar16);
          }
          else {
            fVar16 = SQRT(fVar16);
          }
          fVar17 = fVar17 * (1.0 / fVar16);
          fVar19 = fVar19 * (1.0 / fVar16);
        }
        pIVar5[iVar4].x = fVar19;
        pIVar5[iVar4].y = -fVar17;
        uVar6 = uVar15 & 0xffffffff;
        uVar15 = uVar15 + 1;
      } while (uVar8 != uVar15);
      fVar20 = fVar20 * 0.5;
      uVar8 = 1;
      if (1 < points_count) {
        uVar8 = uVar9;
      }
      uVar9 = 0;
      do {
        fVar16 = (pIVar5[uVar9].x + pIVar5[(int)uVar14].x) * 0.5;
        fVar17 = (pIVar5[uVar9].y + pIVar5[(int)uVar14].y) * 0.5;
        fVar19 = fVar16 * fVar16 + fVar17 * fVar17;
        if (1e-06 < fVar19) {
          fVar19 = 1.0 / fVar19;
          fVar18 = 100.0;
          if (fVar19 <= 100.0) {
            fVar18 = fVar19;
          }
          fVar16 = fVar16 * fVar18;
          fVar17 = fVar17 * fVar18;
        }
        fVar16 = fVar20 * fVar16;
        fVar17 = fVar17 * fVar20;
        (this->_VtxWritePtr->pos).x = points[uVar9].x - fVar16;
        (this->_VtxWritePtr->pos).y = points[uVar9].y - fVar17;
        this->_VtxWritePtr->uv = IVar1;
        this->_VtxWritePtr->col = col;
        this->_VtxWritePtr[1].pos.x = fVar16 + points[uVar9].x;
        this->_VtxWritePtr[1].pos.y = fVar17 + points[uVar9].y;
        this->_VtxWritePtr[1].uv = IVar1;
        this->_VtxWritePtr[1].col = col & 0xffffff;
        this->_VtxWritePtr = this->_VtxWritePtr + 2;
        IVar11 = (ImDrawIdx)uVar12;
        *this->_IdxWritePtr = IVar11;
        this->_IdxWritePtr[1] = IVar3 + (short)uVar14 * 2;
        IVar13 = IVar3 + 1 + (short)uVar14 * 2;
        this->_IdxWritePtr[2] = IVar13;
        this->_IdxWritePtr[3] = IVar13;
        this->_IdxWritePtr[4] = IVar11 + 1;
        this->_IdxWritePtr[5] = IVar11;
        this->_IdxWritePtr = this->_IdxWritePtr + 6;
        uVar14 = uVar9 & 0xffffffff;
        uVar9 = uVar9 + 1;
        uVar12 = uVar12 + 2;
      } while (uVar8 != uVar9);
      uVar12 = points_count * 2 & 0xfffe;
    }
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + uVar12;
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2)*3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + ((i - 1) << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (i << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        _Data->TempBuffer.reserve_discard(points_count);
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + i - 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}